

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

UfsType __thiscall
Clasp::DefaultUnfoundedCheck::findNonHcfUfs(DefaultUnfoundedCheck *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  MinimalityCheck *pMVar3;
  NonHcfIter ppNVar4;
  iterator puVar5;
  AtomNode *pAVar6;
  reference __a;
  reference __b;
  long in_RSI;
  long in_RDI;
  VarVec *in_stack_00000018;
  LitVec *in_stack_00000020;
  Solver *in_stack_00000028;
  NonHcfComponent *in_stack_00000030;
  const_iterator end;
  const_iterator it;
  uint32 minDL;
  uint32 pos;
  uint32 checks;
  HccIter hEnd;
  HccIter hIt;
  undefined4 in_stack_ffffffffffffff58;
  NodeId in_stack_ffffffffffffff5c;
  Solver *in_stack_ffffffffffffff60;
  Solver *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Literal in_stack_ffffffffffffff74;
  iterator local_40;
  uint local_34;
  size_type local_30;
  uint32 local_2c;
  NonHcfIter local_20;
  
  local_20 = Asp::PrgDepGraph::nonHcfBegin((PrgDepGraph *)0x20f1dd);
  pMVar3 = SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::
           operator->((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                       *)0x20f1f0);
  local_20 = local_20 + pMVar3->scc;
  ppNVar4 = Asp::PrgDepGraph::nonHcfEnd((PrgDepGraph *)0x20f218);
  local_2c = Asp::PrgDepGraph::numNonHcfs((PrgDepGraph *)0x20f231);
  while( true ) {
    if (local_2c == 0) {
      SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                  *)0x20f51e);
      Solver::decisionLevel((Solver *)0x20f530);
      MinimalityCheck::schedNext
                ((MinimalityCheck *)
                 CONCAT44(in_stack_ffffffffffffff74.rep_,in_stack_ffffffffffffff70),
                 (uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
      return ufs_none;
    }
    uVar2 = Solver::numFreeVars((Solver *)0x20f269);
    SolverStats::addTest((SolverStats *)(in_RSI + 0x28),uVar2 != 0);
    Asp::PrgDepGraph::NonHcfComponent::assumptionsFromAssignment
              ((NonHcfComponent *)in_stack_ffffffffffffff60,
               (Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (LitVec *)0x20f2a3);
    bVar1 = Asp::PrgDepGraph::NonHcfComponent::test
                      (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    if ((!bVar1) || (bVar1 = Solver::hasConflict((Solver *)0x20f2e1), bVar1)) break;
    local_20 = local_20 + 1;
    if (local_20 == ppNVar4) {
      local_20 = Asp::PrgDepGraph::nonHcfBegin((PrgDepGraph *)0x20f4f2);
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
    local_2c = local_2c - 1;
  }
  local_30 = 0;
  local_34 = 0xffffffff;
  local_40 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x78));
  puVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x78));
  for (; local_40 != puVar5; local_40 = local_40 + 1) {
    Asp::PrgDepGraph::getAtom((PrgDepGraph *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar1 = Solver::isTrue(in_stack_ffffffffffffff68,in_stack_ffffffffffffff74);
    if (bVar1) {
      pAVar6 = Asp::PrgDepGraph::getAtom
                         ((PrgDepGraph *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      Literal::var((Literal *)pAVar6);
      uVar2 = Solver::level(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if (uVar2 < local_34) {
        pAVar6 = Asp::PrgDepGraph::getAtom
                           ((PrgDepGraph *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        Literal::var((Literal *)pAVar6);
        local_34 = Solver::level(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        local_30 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (in_RDI + 0x60));
      }
    }
    pushUfs((DefaultUnfoundedCheck *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (local_30 != 0) {
    __a = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x60));
    __b = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x60),
                     local_30);
    std::swap<unsigned_int>(__a,__b);
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x78));
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 200));
  ppNVar4 = Asp::PrgDepGraph::nonHcfBegin((PrgDepGraph *)0x20f48e);
  uVar2 = (uint32)((long)local_20 - (long)ppNVar4 >> 3);
  pMVar3 = SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::
           operator->((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                       *)0x20f4af);
  pMVar3->scc = uVar2;
  return ufs_non_poly;
}

Assistant:

DefaultUnfoundedCheck::UfsType DefaultUnfoundedCheck::findNonHcfUfs(Solver& s) {
	assert(invalidQ_.empty() && loopAtoms_.empty());
	typedef DependencyGraph::NonHcfIter HccIter;
	HccIter hIt  = graph_->nonHcfBegin() + mini_->scc;
	HccIter hEnd = graph_->nonHcfEnd();
	for (uint32 checks = graph_->numNonHcfs(); checks--;) {
		s.stats.addTest(s.numFreeVars() != 0);
		(*hIt)->assumptionsFromAssignment(s, loopAtoms_);
		if (!(*hIt)->test(s, loopAtoms_, invalidQ_) || s.hasConflict()) {
			uint32 pos = 0, minDL = UINT32_MAX;
			for (VarVec::const_iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if (s.isTrue(graph_->getAtom(*it).lit) && s.level(graph_->getAtom(*it).lit.var()) < minDL) {
					minDL = s.level(graph_->getAtom(*it).lit.var());
					pos   = (uint32)ufs_.vec.size();
				}
				pushUfs(*it);
			}
			if (pos) {
				std::swap(ufs_.vec.front(), ufs_.vec[pos]);
			}
			invalidQ_.clear();
			loopAtoms_.clear();
			mini_->scc = static_cast<uint32>(hIt - graph_->nonHcfBegin());
			return ufs_non_poly;
		}
		if (++hIt == hEnd) { hIt = graph_->nonHcfBegin(); }
		loopAtoms_.clear();
	}
	mini_->schedNext(s.decisionLevel(), true);
	return ufs_none;
}